

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_pool.c
# Opt level: O0

upb_FileDef * upb_DefPool_FindFileContainingSymbol(upb_DefPool *s,char *name)

{
  _Bool _Var1;
  upb_deftype_t uVar2;
  upb_FieldDef *f_00;
  upb_EnumValueDef *v_00;
  upb_EnumDef *puVar3;
  upb_ServiceDef *s_00;
  char *pcVar4;
  upb_MessageDef *puVar5;
  size_t len;
  upb_FileDef *puVar6;
  char *shortname;
  upb_MessageDef *parent;
  char *last_dot;
  upb_ServiceDef *service;
  upb_EnumValueDef *ev;
  upb_EnumDef *e;
  upb_MessageDef *m;
  upb_FieldDef *f;
  upb_value v;
  char *name_local;
  upb_DefPool *s_local;
  
  v.val = (uint64_t)name;
  _Var1 = upb_strtable_lookup(&s->syms,name,(upb_value *)&f);
  if (_Var1) {
    uVar2 = _upb_DefType_Type((upb_value)f);
    switch(uVar2) {
    case UPB_DEFTYPE_EXT:
      f_00 = (upb_FieldDef *)_upb_DefType_Unpack((upb_value)f,UPB_DEFTYPE_EXT);
      s_local = (upb_DefPool *)upb_FieldDef_File(f_00);
      break;
    case UPB_DEFTYPE_MSG:
      puVar5 = (upb_MessageDef *)_upb_DefType_Unpack((upb_value)f,UPB_DEFTYPE_MSG);
      s_local = (upb_DefPool *)upb_MessageDef_File(puVar5);
      break;
    case UPB_DEFTYPE_ENUM:
      puVar3 = (upb_EnumDef *)_upb_DefType_Unpack((upb_value)f,UPB_DEFTYPE_ENUM);
      s_local = (upb_DefPool *)upb_EnumDef_File(puVar3);
      break;
    case UPB_DEFTYPE_ENUMVAL:
      v_00 = (upb_EnumValueDef *)_upb_DefType_Unpack((upb_value)f,UPB_DEFTYPE_ENUMVAL);
      puVar3 = upb_EnumValueDef_Enum(v_00);
      s_local = (upb_DefPool *)upb_EnumDef_File(puVar3);
      break;
    case UPB_DEFTYPE_SERVICE:
      s_00 = (upb_ServiceDef *)_upb_DefType_Unpack((upb_value)f,UPB_DEFTYPE_SERVICE);
      s_local = (upb_DefPool *)upb_ServiceDef_File(s_00);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/reflection/def_pool.c"
                    ,0x12d,
                    "const upb_FileDef *upb_DefPool_FindFileContainingSymbol(const upb_DefPool *, const char *)"
                   );
    }
  }
  else {
    pcVar4 = strrchr((char *)v.val,0x2e);
    if ((pcVar4 != (char *)0x0) &&
       (puVar5 = upb_DefPool_FindMessageByNameWithSize(s,(char *)v.val,(long)pcVar4 - v.val),
       puVar5 != (upb_MessageDef *)0x0)) {
      len = strlen(pcVar4 + 1);
      _Var1 = upb_MessageDef_FindByNameWithSize
                        (puVar5,pcVar4 + 1,len,(upb_FieldDef **)0x0,(upb_OneofDef **)0x0);
      if (_Var1) {
        puVar6 = upb_MessageDef_File(puVar5);
        return puVar6;
      }
    }
    s_local = (upb_DefPool *)0x0;
  }
  return (upb_FileDef *)s_local;
}

Assistant:

const upb_FileDef* upb_DefPool_FindFileContainingSymbol(const upb_DefPool* s,
                                                        const char* name) {
  upb_value v;
  // TODO: non-extension fields and oneofs.
  if (upb_strtable_lookup(&s->syms, name, &v)) {
    switch (_upb_DefType_Type(v)) {
      case UPB_DEFTYPE_EXT: {
        const upb_FieldDef* f = _upb_DefType_Unpack(v, UPB_DEFTYPE_EXT);
        return upb_FieldDef_File(f);
      }
      case UPB_DEFTYPE_MSG: {
        const upb_MessageDef* m = _upb_DefType_Unpack(v, UPB_DEFTYPE_MSG);
        return upb_MessageDef_File(m);
      }
      case UPB_DEFTYPE_ENUM: {
        const upb_EnumDef* e = _upb_DefType_Unpack(v, UPB_DEFTYPE_ENUM);
        return upb_EnumDef_File(e);
      }
      case UPB_DEFTYPE_ENUMVAL: {
        const upb_EnumValueDef* ev =
            _upb_DefType_Unpack(v, UPB_DEFTYPE_ENUMVAL);
        return upb_EnumDef_File(upb_EnumValueDef_Enum(ev));
      }
      case UPB_DEFTYPE_SERVICE: {
        const upb_ServiceDef* service =
            _upb_DefType_Unpack(v, UPB_DEFTYPE_SERVICE);
        return upb_ServiceDef_File(service);
      }
      default:
        UPB_UNREACHABLE();
    }
  }

  const char* last_dot = strrchr(name, '.');
  if (last_dot) {
    const upb_MessageDef* parent =
        upb_DefPool_FindMessageByNameWithSize(s, name, last_dot - name);
    if (parent) {
      const char* shortname = last_dot + 1;
      if (upb_MessageDef_FindByNameWithSize(parent, shortname,
                                            strlen(shortname), NULL, NULL)) {
        return upb_MessageDef_File(parent);
      }
    }
  }

  return NULL;
}